

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Expression * __thiscall Parser::parseExpression(Parser *this)

{
  bool bVar1;
  FILE *pFVar2;
  int iVar3;
  FILE *p1;
  const_iterator cVar4;
  iterator iVar5;
  Operate *o;
  FILE *p2;
  Expression *this_00;
  bool bVar6;
  string p2Type;
  string p1Type;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined8 local_130 [4];
  key_type local_110;
  key_type local_f0;
  string local_d0;
  undefined8 local_b0 [4];
  key_type local_90;
  key_type local_70;
  undefined8 local_50 [4];
  
  p1 = (FILE *)parsePrimaryExpression(this);
  (**(code **)(*(long *)p1 + 0x18))(&local_150,p1);
  p2 = _stderr;
  if (local_150._M_string_length == 0) {
    (*(code *)**(undefined8 **)p1)(&local_f0,p1);
    parseExpression();
LAB_001175b6:
    p1 = _stderr;
    (*(code *)**(undefined8 **)p2)(&local_110,p2);
    parseExpression();
  }
  else {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_150,"STRING");
    if (iVar3 == 0) {
LAB_0011722e:
      (*(code *)**(undefined8 **)p1)(&local_f0,p1);
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>_>
              ::find(&(this->var_table)._M_t,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)cVar4._M_node != &(this->var_table)._M_t._M_impl.super__Rb_tree_header)
      {
        (*(code *)**(undefined8 **)p1)(&local_70,p1);
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>_>
                ::find(&(this->var_table)._M_t,&local_70);
        (*(code *)**(undefined8 **)iVar5._M_node[2]._M_left)(&local_f0);
        parseExpression();
      }
    }
    else {
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_150,"CHAR");
      if (iVar3 == 0) goto LAB_0011722e;
    }
    Scanner::toUpper(&local_170,&local_150);
    parseExpression();
    o = parseOperator(this);
    p2 = (FILE *)parsePrimaryExpression(this);
    (**(code **)(*(long *)p2 + 0x18))(&local_170,p2);
    if (local_170._M_string_length == 0) goto LAB_001175b6;
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_170,"STRING");
    if (iVar3 == 0) {
LAB_00117348:
      (*(code *)**(undefined8 **)p2)(&local_110,p2);
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>_>
              ::find(&(this->var_table)._M_t,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)cVar4._M_node != &(this->var_table)._M_t._M_impl.super__Rb_tree_header)
      {
        (*(code *)**(undefined8 **)p2)(&local_90,p2);
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>_>
                ::find(&(this->var_table)._M_t,&local_90);
        (*(code *)**(undefined8 **)iVar5._M_node[2]._M_left)(&local_110);
        parseExpression();
      }
    }
    else {
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_170,"CHAR");
      if (iVar3 == 0) goto LAB_00117348;
    }
    Scanner::toUpper(&local_d0,&local_170);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_170,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_170._M_string_length == local_150._M_string_length) {
      if (local_170._M_string_length != 0) {
        iVar3 = bcmp(local_170._M_dataplus._M_p,local_150._M_dataplus._M_p,
                     local_170._M_string_length);
        if (iVar3 != 0) goto LAB_00117471;
      }
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_150,"STRING");
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_150,"CHAR");
        if (iVar3 != 0) goto LAB_00117471;
      }
      (**(o->super_Terminal).super_AST._vptr_AST)(&local_d0,o);
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_d0,"+");
      bVar6 = iVar3 != 0;
      bVar1 = true;
    }
    else {
LAB_00117471:
      bVar1 = false;
      bVar6 = false;
    }
    if ((bVar1) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2)) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    pFVar2 = _stderr;
    if (bVar6) {
      (**(o->super_Terminal).super_AST._vptr_AST)(local_130,o);
      (*(code *)**(undefined8 **)p1)(local_b0,p1);
      (*(code *)**(undefined8 **)p2)(local_50,p2);
      fprintf(pFVar2,
              "\x1b[31m\nFATAL: Invalid Operator \'%s\' for Strings \'%s\' and \'%s\'\n\x1b[0m",
              local_130[0],local_b0[0],local_50[0]);
      std::__cxx11::string::~string((string *)local_50);
      goto LAB_001176b2;
    }
    if (local_150._M_string_length == local_170._M_string_length) {
      if (local_150._M_string_length == 0) {
LAB_001174cb:
        fprintf(_stdout,
                "\x1b[32m\t = PrimaryExpression1 [Type \'%s\'] matches PrimaryExpression2 [Type \'%s\']\n\x1b[0m"
                ,local_150._M_dataplus._M_p,local_170._M_dataplus._M_p);
        this_00 = (Expression *)operator_new(0x20);
        Expression::Expression(this_00,(PrimaryExpression *)p1,(PrimaryExpression *)p2,o);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        return this_00;
      }
      iVar3 = bcmp(local_150._M_dataplus._M_p,local_170._M_dataplus._M_p,local_150._M_string_length)
      ;
      if (iVar3 == 0) goto LAB_001174cb;
    }
  }
  pFVar2 = _stderr;
  (*(code *)**(undefined8 **)p1)(local_130,p1);
  (*(code *)**(undefined8 **)p2)(local_b0,p2);
  fprintf(pFVar2,
          "\x1b[31m\nFATAL: Incompatible types: \nP1: %s [Type \'%s\']\nP2: %s [Type \'%s\']\n\x1b[0m"
          ,local_130[0],local_150._M_dataplus._M_p,local_b0[0],local_170._M_dataplus._M_p);
LAB_001176b2:
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_130);
  exit(1);
}

Assistant:

Expression *Parser::parseExpression() {
    // parse primary expression
    PrimaryExpression *p1 = parsePrimaryExpression();
    std::string p1Type = p1->getType();
    if (p1Type.length() == 0) {
        fprintf(stderr, ANSI_COLOR_RED "\nFATAL: Unknown type for variable: \'%s\' [Type \'%s\']\n" ANSI_COLOR_RESET,
                p1->describe().data(), p1Type.data());
        exit(1);
    }
    // Check if variable/expression defined in vartable, then change data type appropriately
    if (p1Type == "STRING" || p1Type == "CHAR") {
        if (checkVarExists(p1->describe())) {
            p1Type = var_table.find(p1->describe())->second.type->describe();
        }
    }
    p1Type = Scanner::toUpper(p1Type);

    // parse operator
    Operate *o1 = parseOperator();

    // parse primary expression
    PrimaryExpression *p2 = parsePrimaryExpression();
    std::string p2Type = p2->getType();
    if (p2Type.length() == 0) {
        fprintf(stderr, ANSI_COLOR_RED "\nFATAL: Unknown type for variable: \'%s\' [Type \'%s\']\n" ANSI_COLOR_RESET,
                p2->describe().data(), p2Type.data());
        exit(1);
    }
    // Check if variable/expression defined in vartable, then change data type appropriately
    if (p2Type == "STRING" || p2Type == "CHAR") {
        if (checkVarExists(p2->describe())) {
            p2Type = var_table.find(p2->describe())->second.type->describe();
        }
    }
    p2Type = Scanner::toUpper(p2Type);

    // Check + is used with strings or chars
    if (p2Type == p1Type && (p1Type == "STRING" || p1Type == "CHAR") && o1->describe() != "+") {
        fprintf(stderr,
                ANSI_COLOR_RED "\nFATAL: Invalid Operator \'%s\' for Strings \'%s\' and \'%s\'\n" ANSI_COLOR_RESET,
                o1->describe().data(), p1->describe().data(), p2->describe().data());
        exit(1);
    }

    // Check incompatible types
    if (p1Type != p2Type) {
        fprintf(stderr,
                ANSI_COLOR_RED "\nFATAL: Incompatible types: \nP1: %s [Type \'%s\']\nP2: %s [Type \'%s\']\n" ANSI_COLOR_RESET,
                p1->describe().data(), p1Type.data(), p2->describe().data(), p2Type.data());
        exit(1);
    }

    if (_VERBOSITY >= 3) {
        fprintf(stdout,
                ANSI_COLOR_GREEN "\t = PrimaryExpression1 [Type \'%s\'] matches PrimaryExpression2 [Type \'%s\']\n" ANSI_COLOR_RESET,
                p1Type.data(), p2Type.data());
    }

    // Build Expression
    return new Expression(p1, p2, o1);
}